

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O0

void __thiscall
HDWallet_GenerateBip84KeyTest_Test::TestBody(HDWallet_GenerateBip84KeyTest_Test *this)

{
  allocator<unsigned_int> *paVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  bool bVar2;
  char *pcVar3;
  reference this_00;
  AssertHelper local_17f8;
  Message local_17f0;
  string local_17e8;
  undefined1 local_17c8 [8];
  AssertionResult gtest_ar_18;
  Message local_17b0;
  size_type local_17a8;
  int local_179c;
  undefined1 local_1798 [8];
  AssertionResult gtest_ar_17;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addrs;
  Message local_1768;
  string local_1760;
  undefined1 local_1740 [8];
  AssertionResult gtest_ar_16;
  Address addr;
  Message local_15a8;
  Bip32FormatType local_159c;
  undefined1 local_1598 [8];
  AssertionResult gtest_ar_15;
  Message local_1580;
  NetType local_1578 [2];
  undefined1 local_1570 [8];
  AssertionResult gtest_ar_14;
  string local_1558;
  undefined1 local_1538 [8];
  ExtPubkey zpub1;
  Message local_14a0;
  Bip32FormatType local_1494;
  undefined1 local_1490 [8];
  AssertionResult gtest_ar_13;
  Message local_1478;
  NetType local_1470 [2];
  undefined1 local_1468 [8];
  AssertionResult gtest_ar_12;
  string local_1450;
  undefined1 local_1430 [8];
  ExtPrivkey vpriv1;
  Message local_1398;
  string local_1390;
  undefined1 local_1370 [8];
  AssertionResult gtest_ar_11;
  Message local_1358;
  KeyData local_1350;
  undefined1 local_11c8 [8];
  KeyData keypath2;
  uint local_1038 [2];
  iterator local_1030;
  size_type local_1028;
  undefined1 local_1020 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path2;
  Message local_1000;
  string local_ff8;
  undefined1 local_fd8 [8];
  AssertionResult gtest_ar_10;
  Message local_fc0;
  string local_fb8;
  undefined1 local_f98 [8];
  AssertionResult gtest_ar_9;
  Message local_f80;
  allocator local_f71;
  string local_f70;
  KeyData local_f50;
  AssertHelper local_dc8;
  Message local_dc0;
  string local_db8;
  undefined1 local_d98 [8];
  AssertionResult gtest_ar_8;
  Message local_d80;
  allocator local_d71;
  string local_d70;
  ExtPubkey local_d50;
  undefined1 local_cc0 [8];
  ExtPubkey pubkeyh;
  Message local_c28;
  string local_c20;
  undefined1 local_c00 [8];
  AssertionResult gtest_ar_7;
  Message local_be8;
  ExtPubkey local_be0;
  undefined1 local_b50 [8];
  ExtPubkey pubkey0;
  Message local_ab8;
  string local_ab0;
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_6;
  Message local_a78;
  ExtPubkey local_a70;
  AssertHelper local_9e0;
  Message local_9d8;
  string local_9d0;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_5;
  Message local_998;
  ExtPubkey local_990;
  undefined1 local_900 [8];
  ExtPubkey pubkey;
  Message local_868;
  string local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_4;
  Message local_828;
  string local_820;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_3;
  Message local_7e8;
  allocator local_7d9;
  string local_7d8;
  KeyData local_7b8;
  undefined1 local_630 [8];
  KeyData keypath1;
  Message local_4a0;
  string local_498;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_2;
  Message local_460;
  ExtPrivkey local_458;
  undefined1 local_3c8 [8];
  ExtPrivkey privkey0;
  uint local_330 [2];
  iterator local_328;
  size_type local_320;
  undefined1 local_318 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  Message local_2f8;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_1;
  Message local_2b8;
  ExtPrivkey local_2b0;
  AssertHelper local_220;
  Message local_218;
  string local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  Message local_1d8;
  ExtPrivkey local_1d0;
  undefined1 local_140 [8];
  ExtPrivkey privkey;
  Bip32FormatType format_type;
  Message local_a0 [2];
  HDWallet local_90;
  undefined1 local_78 [8];
  HDWallet wallet;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData seed;
  HDWallet_GenerateBip84KeyTest_Test *this_local;
  
  seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "c55257c360c07c72029aebc1b53c05ed0362ada38ead3e3e9efa3708e53495531f09a6987599d18264c1e1c92f2cf141630c7a3c4ab7c81b2f001698e7463b04"
             ,&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_78);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::HDWallet(&local_90,(ByteData *)local_28);
      cfd::core::HDWallet::operator=((HDWallet *)local_78,&local_90);
      cfd::core::HDWallet::~HDWallet(&local_90);
    }
  }
  else {
    testing::Message::Message(local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1c8,
               "Expected: (wallet = HDWallet(seed)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff58,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
    testing::Message::~Message(local_a0);
  }
  privkey.super_Extkey.tweak_sum_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = kBip84;
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_140);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkey
                (&local_1d0,(HDWallet *)local_78,kMainnet,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_140,&local_1d0);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_1d0);
    }
  }
  else {
    testing::Message::Message(&local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1cd,
               "Expected: (privkey = wallet.GeneratePrivkey( NetType::kMainnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_1d8);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_210,(Extkey *)local_140);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1f0,"privkey.ToString().c_str()",
             "\"zprvAWgYBBk7JR8GkHRttGHqPJxoxVLUYweUAtdWqJvWxCPYuJjmZc3HFCmx4TrzbTYrdcuUWZGZK6FPcp3bMJFjYqK83uLgo9MEqtGp2Q3TeVC\""
             ,pcVar3,
             "zprvAWgYBBk7JR8GkHRttGHqPJxoxVLUYweUAtdWqJvWxCPYuJjmZc3HFCmx4TrzbTYrdcuUWZGZK6FPcp3bMJFjYqK83uLgo9MEqtGp2Q3TeVC"
            );
  std::__cxx11::string::~string((string *)&local_210);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ce,pcVar3);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkey
                (&local_2b0,(HDWallet *)local_78,kTestnet,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_140,&local_2b0);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_2b0);
    }
  }
  else {
    testing::Message::Message(&local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d0,
               "Expected: (privkey = wallet.GeneratePrivkey(NetType::kTestnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2b8);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_2f0,(Extkey *)local_140);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2d0,"privkey.ToString().c_str()",
             "\"vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M\""
             ,pcVar3,
             "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M"
            );
  std::__cxx11::string::~string((string *)&local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d1,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_330[0] = 0;
  local_330[1] = 0x2c;
  local_328 = local_330;
  local_320 = 2;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&privkey0.super_Extkey.tweak_sum_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 0x17);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_00._M_len = local_320;
  __l_00._M_array = local_328;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_318,__l_00,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&privkey0.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x17));
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_3c8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePrivkey
                (&local_458,(HDWallet *)local_78,kMainnet,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_318,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::ExtPrivkey::operator=((ExtPrivkey *)local_3c8,&local_458);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_458);
    }
  }
  else {
    testing::Message::Message(&local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d6,
               "Expected: (privkey0 = wallet.GeneratePrivkey( NetType::kMainnet, path, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_460);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_498,(Extkey *)local_3c8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_478,"privkey0.ToString().c_str()",
             "\"zprvAbP51MM7gKsMprLRQK7yj9Gd6qXSyS9FhYfioaTXBdgqvmDyfZn29z7qx6HQ6P8LGBLN8ok42PjiTpcJ2nBZ9ZPm5LwnWAvcXocpd6My3ED\""
             ,pcVar3,
             "zprvAbP51MM7gKsMprLRQK7yj9Gd6qXSyS9FhYfioaTXBdgqvmDyfZn29z7qx6HQ6P8LGBLN8ok42PjiTpcJ2nBZ9ZPm5LwnWAvcXocpd6My3ED"
            );
  std::__cxx11::string::~string((string *)&local_498);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar2) {
    testing::Message::Message(&local_4a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &keypath1.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1d7,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &keypath1.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &keypath1.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  cfd::core::KeyData::KeyData((KeyData *)local_630);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7d8,"m/0h/44h",&local_7d9);
      cfd::core::HDWallet::GeneratePrivkeyData
                (&local_7b8,(HDWallet *)local_78,kMainnet,&local_7d8,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::KeyData::operator=((KeyData *)local_630,&local_7b8);
      cfd::core::KeyData::~KeyData(&local_7b8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
    }
  }
  else {
    testing::Message::Message(&local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1db,
               "Expected: (keypath1 = wallet.GeneratePrivkeyData( NetType::kMainnet, \"m/0h/44h\", format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_7e8);
  }
  cfd::core::KeyData::ToString_abi_cxx11_(&local_820,(KeyData *)local_630,true,kApostrophe,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_800,"keypath1.ToString().c_str()",
             "\"[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a"
            );
  std::__cxx11::string::~string((string *)&local_820);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar2) {
    testing::Message::Message(&local_828);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1dc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_860,(KeyData *)local_630,false,kApostrophe,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_840,"keypath1.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']zprvAcHDZaJ62CDoCw2Bv174ejS8qDQJjPXDPpB3gi9ebzSGrEAixW1a2MD33k9csZy187Vy1hhdBuPTy1pR4tWBihdABH41aGxQkU7MVShYZ43\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']zprvAcHDZaJ62CDoCw2Bv174ejS8qDQJjPXDPpB3gi9ebzSGrEAixW1a2MD33k9csZy187Vy1hhdBuPTy1pR4tWBihdABH41aGxQkU7MVShYZ43"
            );
  std::__cxx11::string::~string((string *)&local_860);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar2) {
    testing::Message::Message(&local_868);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&pubkey.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1dd,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&pubkey.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_868);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&pubkey.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_900);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePubkey
                (&local_990,(HDWallet *)local_78,kMainnet,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::ExtPubkey::operator=((ExtPubkey *)local_900,&local_990);
      cfd::core::ExtPubkey::~ExtPubkey(&local_990);
    }
  }
  else {
    testing::Message::Message(&local_998);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e0,
               "Expected: (pubkey = wallet.GeneratePubkey(NetType::kMainnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_998);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_9d0,(Extkey *)local_900);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9b0,"pubkey.ToString().c_str()",
             "\"zpub6jftahH18ngZxmWMzHpqkSuYWXAxxQNKY7Z7dhL8WXvXn74v79MXo16RujDNiprgNfpHNYzmaPQAKAkf8mXRXpxx29DbpsdKFQEahN6FZ3c\""
             ,pcVar3,
             "zpub6jftahH18ngZxmWMzHpqkSuYWXAxxQNKY7Z7dhL8WXvXn74v79MXo16RujDNiprgNfpHNYzmaPQAKAkf8mXRXpxx29DbpsdKFQEahN6FZ3c"
            );
  std::__cxx11::string::~string((string *)&local_9d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar2) {
    testing::Message::Message(&local_9d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9e0,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9e0);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePubkey
                (&local_a70,(HDWallet *)local_78,kTestnet,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::ExtPubkey::operator=((ExtPubkey *)local_900,&local_a70);
      cfd::core::ExtPubkey::~ExtPubkey(&local_a70);
    }
  }
  else {
    testing::Message::Message(&local_a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e3,
               "Expected: (pubkey = wallet.GeneratePubkey(NetType::kTestnet, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_a78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_a78);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_ab0,(Extkey *)local_900);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a90,"pubkey.ToString().c_str()",
             "\"vpub5SLqN2bLY4WeZajtergLv6XXpebBBvQKsfUEW7kazWR1Zhp16WhHJkTspuP2jCEzk7M4NecXjjyxn2JQFysNLtEYYnRuVEMNAVz194Xi9T8\""
             ,pcVar3,
             "vpub5SLqN2bLY4WeZajtergLv6XXpebBBvQKsfUEW7kazWR1Zhp16WhHJkTspuP2jCEzk7M4NecXjjyxn2JQFysNLtEYYnRuVEMNAVz194Xi9T8"
            );
  std::__cxx11::string::~string((string *)&local_ab0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
  if (!bVar2) {
    testing::Message::Message(&local_ab8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&pubkey0.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e4,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&pubkey0.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_ab8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&pubkey0.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_b50);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePubkey
                (&local_be0,(HDWallet *)local_78,kMainnet,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_318,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::ExtPubkey::operator=((ExtPubkey *)local_b50,&local_be0);
      cfd::core::ExtPubkey::~ExtPubkey(&local_be0);
    }
  }
  else {
    testing::Message::Message(&local_be8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e7,
               "Expected: (pubkey0 = wallet.GeneratePubkey(NetType::kMainnet, path, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_be8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_be8);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_c20,(Extkey *)local_b50);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c00,"pubkey0.ToString().c_str()",
             "\"zpub6pNRQrt1WhRf3LQtWLez6HDMesMwNts74mbKbxs8jyDpoZZ8D76GhnSKoMHBaJPZuxPVGqBLYXPEQTJ38J6KKPYJp5KE8DPcK6k5x6Gq8Vj\""
             ,pcVar3,
             "zpub6pNRQrt1WhRf3LQtWLez6HDMesMwNts74mbKbxs8jyDpoZZ8D76GhnSKoMHBaJPZuxPVGqBLYXPEQTJ38J6KKPYJp5KE8DPcK6k5x6Gq8Vj"
            );
  std::__cxx11::string::~string((string *)&local_c20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c00);
  if (!bVar2) {
    testing::Message::Message(&local_c28);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&pubkeyh.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1e8,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&pubkeyh.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_c28);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&pubkeyh.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_c28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c00);
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_cc0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d70,"m/0H/44H",&local_d71);
      cfd::core::HDWallet::GeneratePubkey
                (&local_d50,(HDWallet *)local_78,kMainnet,&local_d70,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::ExtPubkey::operator=((ExtPubkey *)local_cc0,&local_d50);
      cfd::core::ExtPubkey::~ExtPubkey(&local_d50);
      std::__cxx11::string::~string((string *)&local_d70);
      std::allocator<char>::~allocator((allocator<char> *)&local_d71);
    }
  }
  else {
    testing::Message::Message(&local_d80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1eb,
               "Expected: (pubkeyh = wallet.GeneratePubkey(NetType::kMainnet, \"m/0H/44H\", format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_d80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_d80);
  }
  cfd::core::Extkey::ToString_abi_cxx11_(&local_db8,(Extkey *)local_cc0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d98,"pubkeyh.ToString().c_str()",
             "\"zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg\""
             ,pcVar3,
             "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
            );
  std::__cxx11::string::~string((string *)&local_db8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d98);
  if (!bVar2) {
    testing::Message::Message(&local_dc0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d98);
    testing::internal::AssertHelper::AssertHelper
              (&local_dc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ec,pcVar3);
    testing::internal::AssertHelper::operator=(&local_dc8,&local_dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_dc8);
    testing::Message::~Message(&local_dc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d98);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f70,"m/0H/44H",&local_f71);
      cfd::core::HDWallet::GeneratePubkeyData
                (&local_f50,(HDWallet *)local_78,kMainnet,&local_f70,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::KeyData::operator=((KeyData *)local_630,&local_f50);
      cfd::core::KeyData::~KeyData(&local_f50);
      std::__cxx11::string::~string((string *)&local_f70);
      std::allocator<char>::~allocator((allocator<char> *)&local_f71);
    }
  }
  else {
    testing::Message::Message(&local_f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ee,
               "Expected: (keypath1 = wallet.GeneratePubkeyData(NetType::kMainnet, \"m/0H/44H\", format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_f80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_f80);
  }
  cfd::core::KeyData::ToString_abi_cxx11_(&local_fb8,(KeyData *)local_630,true,kApostrophe,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f98,"keypath1.ToString().c_str()",
             "\"[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a"
            );
  std::__cxx11::string::~string((string *)&local_fb8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f98);
  if (!bVar2) {
    testing::Message::Message(&local_fc0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_fc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_fc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_ff8,(KeyData *)local_630,false,kApostrophe,false);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_fd8,"keypath1.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
            );
  std::__cxx11::string::~string((string *)&local_ff8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd8);
  if (!bVar2) {
    testing::Message::Message(&local_1000);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_fd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &path2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1f0,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &path2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1000);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &path2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1000);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd8);
  local_1038[0] = 0x80000000;
  local_1038[1] = 0x8000002c;
  local_1030 = local_1038;
  local_1028 = 2;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&keypath2.fingerprint_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l._M_len = local_1028;
  __l._M_array = local_1030;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1020,__l,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&keypath2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::KeyData::KeyData((KeyData *)local_11c8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::HDWallet::GeneratePubkeyData
                (&local_1350,(HDWallet *)local_78,kMainnet,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1020,
                 privkey.super_Extkey.tweak_sum_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      cfd::core::KeyData::operator=((KeyData *)local_11c8,&local_1350);
      cfd::core::KeyData::~KeyData(&local_1350);
    }
  }
  else {
    testing::Message::Message(&local_1358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,500,
               "Expected: (keypath2 = wallet.GeneratePubkeyData(NetType::kMainnet, path2, format_type)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1358);
  }
  cfd::core::KeyData::ToString_abi_cxx11_(&local_1390,(KeyData *)local_11c8,false,kApostrophe,false)
  ;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1370,"keypath2.ToString(false).c_str()",
             "\"[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg\""
             ,pcVar3,
             "[b4e3f5ed/0\'/44\']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
            );
  std::__cxx11::string::~string((string *)&local_1390);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1370);
  if (!bVar2) {
    testing::Message::Message(&local_1398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&vpriv1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1f5,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&vpriv1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_1398);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&vpriv1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_1398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1450,
             "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M"
             ,(allocator *)((long)&gtest_ar_12.message_.ptr_ + 7));
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_1430,&local_1450);
  std::__cxx11::string::~string((string *)&local_1450);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_12.message_.ptr_ + 7));
  local_1470[1] = 1;
  local_1470[0] = cfd::core::Extkey::GetNetworkType((Extkey *)local_1430);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_1468,"NetType::kTestnet","vpriv1.GetNetworkType()",
             local_1470 + 1,local_1470);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1468);
  if (!bVar2) {
    testing::Message::Message(&local_1478);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1fa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_1478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_1478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1468);
  local_1494 = cfd::core::Extkey::GetFormatType((Extkey *)local_1430);
  testing::internal::EqHelper<false>::Compare<cfd::core::Bip32FormatType,cfd::core::Bip32FormatType>
            ((EqHelper<false> *)local_1490,"format_type","vpriv1.GetFormatType()",
             (Bip32FormatType *)
             ((long)&privkey.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x14),&local_1494);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1490);
  if (!bVar2) {
    testing::Message::Message(&local_14a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&zpub1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1fb,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&zpub1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10),&local_14a0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&zpub1.super_Extkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_14a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1558,
             "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg"
             ,(allocator *)((long)&gtest_ar_14.message_.ptr_ + 7));
  cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_1538,&local_1558);
  std::__cxx11::string::~string((string *)&local_1558);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_14.message_.ptr_ + 7));
  local_1578[1] = 0;
  local_1578[0] = cfd::core::Extkey::GetNetworkType((Extkey *)local_1538);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_1570,"NetType::kMainnet","zpub1.GetNetworkType()",
             local_1578 + 1,local_1578);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1570);
  if (!bVar2) {
    testing::Message::Message(&local_1580);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1fe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_1580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_1580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1570);
  local_159c = cfd::core::Extkey::GetFormatType((Extkey *)local_1538);
  testing::internal::EqHelper<false>::Compare<cfd::core::Bip32FormatType,cfd::core::Bip32FormatType>
            ((EqHelper<false> *)local_1598,"format_type","zpub1.GetFormatType()",
             (Bip32FormatType *)
             ((long)&privkey.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x14),&local_159c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1598);
  if (!bVar2) {
    testing::Message::Message(&local_15a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x1ff,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_15a8)
    ;
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::Message::~Message(&local_15a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1598);
  cfd::core::Extkey::GetPubkeyAddress
            ((Address *)&gtest_ar_16.message_,(Extkey *)local_1430,kWitnessUnknown,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1760,(Address *)&gtest_ar_16.message_);
  testing::internal::EqHelper<false>::Compare<char[43],std::__cxx11::string>
            ((EqHelper<false> *)local_1740,"\"tb1qkn3ltmgeg0cx9gk7kjlxs8qjnuhlkj87a0sz6l\"",
             "addr.GetAddress()",(char (*) [43])"tb1qkn3ltmgeg0cx9gk7kjlxs8qjnuhlkj87a0sz6l",
             &local_1760);
  std::__cxx11::string::~string((string *)&local_1760);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1740);
  if (!bVar2) {
    testing::Message::Message(&local_1768);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x204,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1768);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &addrs.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1740);
  cfd::core::Extkey::GetPubkeyAddresses
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
             &gtest_ar_17.message_,(Extkey *)local_1538,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kCustomChain);
  local_179c = 1;
  local_17a8 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::size
                         ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                          &gtest_ar_17.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_1798,"1","addrs.size()",&local_179c,&local_17a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1798);
  if (!bVar2) {
    testing::Message::Message(&local_17b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x206,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_17b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_17b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1798);
  this_00 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                      ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                       &gtest_ar_17.message_,0);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_17e8,this_00);
  testing::internal::EqHelper<false>::Compare<char[43],std::__cxx11::string>
            ((EqHelper<false> *)local_17c8,"\"bc1qcye3fkjzjwykw5qt3cp4swf0hlvr034j5z07g9\"",
             "addrs[0].GetAddress()",(char (*) [43])"bc1qcye3fkjzjwykw5qt3cp4swf0hlvr034j5z07g9",
             &local_17e8);
  std::__cxx11::string::~string((string *)&local_17e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17c8);
  if (!bVar2) {
    testing::Message::Message(&local_17f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_17c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_17f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0x208,pcVar3);
    testing::internal::AssertHelper::operator=(&local_17f8,&local_17f0);
    testing::internal::AssertHelper::~AssertHelper(&local_17f8);
    testing::Message::~Message(&local_17f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17c8);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
            ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
             &gtest_ar_17.message_);
  cfd::core::Address::~Address((Address *)&gtest_ar_16.message_);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_1538);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_1430);
  cfd::core::KeyData::~KeyData((KeyData *)local_11c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1020);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_cc0);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_b50);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_900);
  cfd::core::KeyData::~KeyData((KeyData *)local_630);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_3c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_318);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_78);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(HDWallet, GenerateBip84KeyTest) {
  ByteData seed("c55257c360c07c72029aebc1b53c05ed0362ada38ead3e3e9efa3708e53495531f09a6987599d18264c1e1c92f2cf141630c7a3c4ab7c81b2f001698e7463b04");

  HDWallet wallet;
  EXPECT_NO_THROW((wallet = HDWallet(seed)));
  auto format_type = Bip32FormatType::kBip84;

  ExtPrivkey privkey;
  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(
    NetType::kMainnet, format_type)));
  EXPECT_STREQ(privkey.ToString().c_str(), "zprvAWgYBBk7JR8GkHRttGHqPJxoxVLUYweUAtdWqJvWxCPYuJjmZc3HFCmx4TrzbTYrdcuUWZGZK6FPcp3bMJFjYqK83uLgo9MEqtGp2Q3TeVC");

  EXPECT_NO_THROW((privkey = wallet.GeneratePrivkey(NetType::kTestnet, format_type)));
  EXPECT_STREQ(privkey.ToString().c_str(), "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M");

  std::vector<uint32_t> path = {0, 44};
  ExtPrivkey privkey0;
  EXPECT_NO_THROW((privkey0 = wallet.GeneratePrivkey(
      NetType::kMainnet, path, format_type)));
  EXPECT_STREQ(privkey0.ToString().c_str(), "zprvAbP51MM7gKsMprLRQK7yj9Gd6qXSyS9FhYfioaTXBdgqvmDyfZn29z7qx6HQ6P8LGBLN8ok42PjiTpcJ2nBZ9ZPm5LwnWAvcXocpd6My3ED");

  KeyData keypath1;
  EXPECT_NO_THROW((keypath1 = wallet.GeneratePrivkeyData(
      NetType::kMainnet, "m/0h/44h", format_type)));
  EXPECT_STREQ(keypath1.ToString().c_str(), "[b4e3f5ed/0'/44']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a");
  EXPECT_STREQ(keypath1.ToString(false).c_str(), "[b4e3f5ed/0'/44']zprvAcHDZaJ62CDoCw2Bv174ejS8qDQJjPXDPpB3gi9ebzSGrEAixW1a2MD33k9csZy187Vy1hhdBuPTy1pR4tWBihdABH41aGxQkU7MVShYZ43");

  ExtPubkey pubkey;
  EXPECT_NO_THROW((pubkey = wallet.GeneratePubkey(NetType::kMainnet, format_type)));
  EXPECT_STREQ(pubkey.ToString().c_str(), "zpub6jftahH18ngZxmWMzHpqkSuYWXAxxQNKY7Z7dhL8WXvXn74v79MXo16RujDNiprgNfpHNYzmaPQAKAkf8mXRXpxx29DbpsdKFQEahN6FZ3c");

  EXPECT_NO_THROW((pubkey = wallet.GeneratePubkey(NetType::kTestnet, format_type)));
  EXPECT_STREQ(pubkey.ToString().c_str(), "vpub5SLqN2bLY4WeZajtergLv6XXpebBBvQKsfUEW7kazWR1Zhp16WhHJkTspuP2jCEzk7M4NecXjjyxn2JQFysNLtEYYnRuVEMNAVz194Xi9T8");

  ExtPubkey pubkey0;
  EXPECT_NO_THROW((pubkey0 = wallet.GeneratePubkey(NetType::kMainnet, path, format_type)));
  EXPECT_STREQ(pubkey0.ToString().c_str(), "zpub6pNRQrt1WhRf3LQtWLez6HDMesMwNts74mbKbxs8jyDpoZZ8D76GhnSKoMHBaJPZuxPVGqBLYXPEQTJ38J6KKPYJp5KE8DPcK6k5x6Gq8Vj");

  ExtPubkey pubkeyh;
  EXPECT_NO_THROW((pubkeyh = wallet.GeneratePubkey(NetType::kMainnet, "m/0H/44H", format_type)));
  EXPECT_STREQ(pubkeyh.ToString().c_str(), "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");
  
  EXPECT_NO_THROW((keypath1 = wallet.GeneratePubkeyData(NetType::kMainnet, "m/0H/44H", format_type)));
  EXPECT_STREQ(keypath1.ToString().c_str(), "[b4e3f5ed/0'/44']035d3d3ee3ce7044686e0eb4697d92478658ac9f854c3c2bccd7a5a8aa74d3fc7a");
  EXPECT_STREQ(keypath1.ToString(false).c_str(), "[b4e3f5ed/0'/44']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");

  std::vector<uint32_t> path2 = {0x80000000, 0x80000000 + 44};
  KeyData keypath2;
  EXPECT_NO_THROW((keypath2 = wallet.GeneratePubkeyData(NetType::kMainnet, path2, format_type)));
  EXPECT_STREQ(keypath2.ToString(false).c_str(), "[b4e3f5ed/0'/44']zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");

  // parse key
  ExtPrivkey vpriv1(
    "vprv9DMUxX4ShgxMM6fRYq9LYxaoGckgnTgUWSYdhjLySAt2guUrYyP2kx9Pye2ebpwB14SFWetKUSqC5fbLUWbgMtaiaYYzTW5Hkz2EU5XXu9M");
  EXPECT_EQ(NetType::kTestnet, vpriv1.GetNetworkType());
  EXPECT_EQ(format_type, vpriv1.GetFormatType());
  ExtPubkey zpub1(
    "zpub6qGZy5pyrZn6RR6f22e51sNsPFEo8rF4m36eV6ZGAKyFj2VsW3Kpa9XWu1zPHAik9DRZxdCrFhoUyR5qnAAtuU6NmRbzd3ngUJ5gr3YCyeg");
  EXPECT_EQ(NetType::kMainnet, zpub1.GetNetworkType());
  EXPECT_EQ(format_type, zpub1.GetFormatType());

  // Get address list
  auto addr = vpriv1.GetPubkeyAddress();
  EXPECT_EQ("tb1qkn3ltmgeg0cx9gk7kjlxs8qjnuhlkj87a0sz6l",
    addr.GetAddress());
  auto addrs = zpub1.GetPubkeyAddresses();
  EXPECT_EQ(1, addrs.size());
  EXPECT_EQ("bc1qcye3fkjzjwykw5qt3cp4swf0hlvr034j5z07g9",
    addrs[0].GetAddress());
}